

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::mark_down(Omega_h *this,Mesh *mesh,Int high_dim,Int low_dim,Read<signed_char> *high_marked)

{
  bool bVar1;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar2;
  char *pcVar3;
  Read<signed_char> RVar4;
  undefined8 uStack_c0;
  undefined1 auStack_b8 [64];
  Graph local_78;
  Adj l2h;
  
  if (low_dim < 0) {
    pcVar3 = "0 <= low_dim";
    uStack_c0 = 0x24;
  }
  else if (high_dim < low_dim) {
    pcVar3 = "low_dim <= high_dim";
    uStack_c0 = 0x25;
  }
  else {
    if ((uint)high_dim < 4) {
      if (high_dim == low_dim) {
        Write<signed_char>::Write((Write<signed_char> *)this,&high_marked->write_);
        pvVar2 = extraout_RDX;
      }
      else {
        Mesh::ask_up(&l2h,mesh,low_dim,high_dim);
        Graph::Graph(&local_78,&l2h.super_Graph);
        Write<signed_char>::Write((Write<signed_char> *)(auStack_b8 + 0x30),&high_marked->write_);
        mark_down(this,&local_78,(Read<signed_char> *)(auStack_b8 + 0x30));
        Write<signed_char>::~Write((Write<signed_char> *)(auStack_b8 + 0x30));
        Graph::~Graph(&local_78);
        bVar1 = Mesh::owners_have_all_upward(mesh,low_dim);
        if (!bVar1) {
          Write<signed_char>::Write
                    ((Write<signed_char> *)(auStack_b8 + 0x20),(Write<signed_char> *)this);
          Mesh::reduce_array<signed_char>
                    ((Mesh *)auStack_b8,(Int)mesh,(Read<signed_char> *)(ulong)(uint)low_dim,
                     (int)auStack_b8 + 0x20,OMEGA_H_MAX);
          Write<signed_char>::operator=((Write<signed_char> *)this,(Write<signed_char> *)auStack_b8)
          ;
          Write<signed_char>::~Write((Write<signed_char> *)auStack_b8);
          Write<signed_char>::~Write((Write<signed_char> *)(auStack_b8 + 0x20));
        }
        Write<signed_char>::Write
                  ((Write<signed_char> *)(auStack_b8 + 0x10),(Write<signed_char> *)this);
        Mesh::sync_array<signed_char>
                  ((Mesh *)auStack_b8,(Int)mesh,(Read<signed_char> *)(ulong)(uint)low_dim,
                   (int)auStack_b8 + 0x10);
        Write<signed_char>::operator=((Write<signed_char> *)this,(Write<signed_char> *)auStack_b8);
        Write<signed_char>::~Write((Write<signed_char> *)auStack_b8);
        Write<signed_char>::~Write((Write<signed_char> *)(auStack_b8 + 0x10));
        Adj::~Adj(&l2h);
        pvVar2 = extraout_RDX_00;
      }
      RVar4.write_.shared_alloc_.direct_ptr = pvVar2;
      RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Read<signed_char>)RVar4.write_.shared_alloc_;
    }
    pcVar3 = "high_dim <= 3";
    uStack_c0 = 0x26;
  }
  fail("assertion %s failed at %s +%d\n",pcVar3,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
       ,uStack_c0);
}

Assistant:

Read<I8> mark_down(
    Mesh* mesh, Int high_dim, Int low_dim, Read<I8> high_marked) {
  OMEGA_H_CHECK(0 <= low_dim);
  OMEGA_H_CHECK(low_dim <= high_dim);
  OMEGA_H_CHECK(high_dim <= 3);
  if (high_dim == low_dim) return high_marked;
  auto l2h = mesh->ask_up(low_dim, high_dim);
  auto low_marks = mark_down(l2h, high_marked);
  if (!mesh->owners_have_all_upward(low_dim)) {
    low_marks = mesh->reduce_array(low_dim, low_marks, 1, OMEGA_H_MAX);
  }
  low_marks = mesh->sync_array(low_dim, low_marks, 1);
  return low_marks;
}